

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

bool __thiscall
Clasp::DefaultUnfoundedCheck::propagateFixpoint
          (DefaultUnfoundedCheck *this,Solver *s,PostPropagator *ctx)

{
  uint uVar1;
  bool checkMin;
  bool bVar2;
  UfsType t;
  uint uVar3;
  ulong uVar4;
  
  if ((ctx == (PostPropagator *)0x0) &&
     (uVar4 = (this->mini_).ptr_ & 0xfffffffffffffffe, uVar4 != 0)) {
    uVar1 = (s->levels_).super_type.ebo_.size;
    if (uVar1 < *(uint *)(uVar4 + 0xc)) {
      uVar3 = (uVar1 - *(uint *)(uVar4 + 0xc)) + *(int *)(uVar4 + 0x10);
      *(uint *)(uVar4 + 0x10) = uVar3;
      *(uint *)(uVar4 + 0xc) = uVar1;
    }
    else {
      uVar3 = *(uint *)(uVar4 + 0x10);
    }
    checkMin = uVar3 == uVar1 || uVar3 == 0;
  }
  else {
    checkMin = false;
  }
  do {
    t = findUfs(this,s,checkMin);
    if (t == ufs_none) goto LAB_00176a28;
    bVar2 = falsifyUfs(this,t);
  } while (bVar2);
  resetTodo(this);
LAB_00176a28:
  return t == ufs_none;
}

Assistant:

bool DefaultUnfoundedCheck::propagateFixpoint(Solver& s, PostPropagator* ctx) {
	bool checkMin = ctx == 0 && mini_.get() && mini_->partialCheck(s.decisionLevel());
	for (UfsType t; (t = findUfs(s, checkMin)) != ufs_none; ) {
		if (!falsifyUfs(t)) {
			resetTodo();
			return false;
		}
	}
	return true;
}